

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkRef(IntegrityCk *pCheck,Pgno iPage)

{
  int iVar1;
  Pgno iPage_local;
  IntegrityCk *pCheck_local;
  
  if ((pCheck->nPage < iPage) || (iPage == 0)) {
    checkAppendMsg(pCheck,"invalid page number %d",(ulong)iPage);
    pCheck_local._4_4_ = 1;
  }
  else {
    iVar1 = getPageReferenced(pCheck,iPage);
    if (iVar1 == 0) {
      setPageReferenced(pCheck,iPage);
      pCheck_local._4_4_ = 0;
    }
    else {
      checkAppendMsg(pCheck,"2nd reference to page %d",(ulong)iPage);
      pCheck_local._4_4_ = 1;
    }
  }
  return pCheck_local._4_4_;
}

Assistant:

static int checkRef(IntegrityCk *pCheck, Pgno iPage){
  if( iPage>pCheck->nPage || iPage==0 ){
    checkAppendMsg(pCheck, "invalid page number %d", iPage);
    return 1;
  }
  if( getPageReferenced(pCheck, iPage) ){
    checkAppendMsg(pCheck, "2nd reference to page %d", iPage);
    return 1;
  }
  setPageReferenced(pCheck, iPage);
  return 0;
}